

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

UdpEntrySyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UdpEntrySyntax,slang::syntax::SyntaxList<slang::syntax::UdpFieldBaseSyntax>const&,slang::parsing::Token&,slang::syntax::UdpFieldBaseSyntax*&,slang::parsing::Token&,slang::syntax::UdpFieldBaseSyntax*&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::UdpFieldBaseSyntax> *args,Token *args_1,
          UdpFieldBaseSyntax **args_2,Token *args_3,UdpFieldBaseSyntax **args_4,Token *args_5)

{
  Token colon1;
  Token colon2;
  Token semi;
  UdpEntrySyntax *this_00;
  
  this_00 = (UdpEntrySyntax *)allocate(this,0x90,8);
  colon1.kind = args_1->kind;
  colon1._2_1_ = args_1->field_0x2;
  colon1.numFlags.raw = (args_1->numFlags).raw;
  colon1.rawLen = args_1->rawLen;
  colon1.info = args_1->info;
  semi.kind = args_5->kind;
  semi._2_1_ = args_5->field_0x2;
  semi.numFlags.raw = (args_5->numFlags).raw;
  semi.rawLen = args_5->rawLen;
  semi.info = args_5->info;
  colon2.kind = args_3->kind;
  colon2._2_1_ = args_3->field_0x2;
  colon2.numFlags.raw = (args_3->numFlags).raw;
  colon2.rawLen = args_3->rawLen;
  colon2.info = args_3->info;
  slang::syntax::UdpEntrySyntax::UdpEntrySyntax(this_00,args,colon1,*args_2,colon2,*args_4,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }